

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O3

char * sha256_Data(sha2_byte *data,size_t len,char *digest)

{
  char *pcVar1;
  SHA256_CTX context;
  SHA256_CTX local_88;
  
  local_88.state[4] = 0x510e527f;
  local_88.state[5] = 0x9b05688c;
  local_88.state[6] = 0x1f83d9ab;
  local_88.state[7] = 0x5be0cd19;
  local_88.state[0] = 0x6a09e667;
  local_88.state[1] = 0xbb67ae85;
  local_88.state[2] = 0x3c6ef372;
  local_88.state[3] = 0xa54ff53a;
  memzero(local_88.buffer,0x40);
  local_88.bitcount = 0;
  sha256_Update(&local_88,data,len);
  pcVar1 = sha256_End(&local_88,digest);
  return pcVar1;
}

Assistant:

char* sha256_Data(const sha2_byte* data, size_t len, char digest[SHA256_DIGEST_STRING_LENGTH]) {
    trezor::SHA256_CTX	context;

	sha256_Init(&context);
	sha256_Update(&context, data, len);
	return sha256_End(&context, digest);
}